

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O1

int ConnectMDM(MDM *pMDM,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  char local_138;
  char local_137;
  
  memset(pMDM->szCfgFilePath,0,0x100);
  sprintf(pMDM->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pMDM->szDevPath + 5,0,0xfb);
    builtin_strncpy(pMDM->szDevPath,"COM1",5);
    pMDM->BaudRate = 0x2580;
    pMDM->timeout = 8000;
    pMDM->threadperiod = 100;
    pMDM->bSaveRawData = 1;
    pMDM->MessageLen = 4;
    pMDM->InternalBufferSize = 0x100;
    pMDM->ModemBitRate = 0x28;
    pMDM->DelayReadWriteEchoByte = 0x14;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c543e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c543e:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pMDM->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c54bd;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c54bd:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c553c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c553c:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c55bb;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c55bb:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c563c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c563c:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c56bd;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c56bd:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->MessageLen);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c573e;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c573e:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->InternalBufferSize);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c57bf;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c57bf:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->ModemBitRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001c5840;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c5840:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->DelayReadWriteEchoByte);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001c58a6;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001c58a6:
  if (pMDM->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pMDM->threadperiod = 100;
  }
  iVar1 = OpenRS232Port(&pMDM->RS232Port,pMDM->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pMDM->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pMDM->RS232Port).hDev,pMDM->BaudRate,'\0',0,'\b','\0',pMDM->timeout),
         iVar1 != 0)) {
        puts("Unable to connect to a MDM.");
        CloseRS232Port(&pMDM->RS232Port);
        goto LAB_001c58e4;
      }
      tcflush(*(int *)&(pMDM->RS232Port).hDev,2);
    }
    puts("MDM connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a MDM.");
LAB_001c58e4:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectMDM(MDM* pMDM, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pMDM->szCfgFilePath, 0, sizeof(pMDM->szCfgFilePath));
	sprintf(pMDM->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMDM->szDevPath, 0, sizeof(pMDM->szDevPath));
		sprintf(pMDM->szDevPath, "COM1");
		pMDM->BaudRate = 9600;
		pMDM->timeout = 8000;
		pMDM->threadperiod = 100;
		pMDM->bSaveRawData = 1;
		pMDM->MessageLen = 4;
		pMDM->InternalBufferSize = 256;
		pMDM->ModemBitRate = 40;
		pMDM->DelayReadWriteEchoByte = 20;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMDM->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->MessageLen) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->InternalBufferSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->ModemBitRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->DelayReadWriteEchoByte) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMDM->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMDM->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pMDM->pfSaveFile = NULL;

	if (OpenRS232Port(&pMDM->RS232Port, pMDM->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMDM->RS232Port, pMDM->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pMDM->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		CloseRS232Port(&pMDM->RS232Port);
		return EXIT_FAILURE;
	}

	printf("MDM connected.\n");

	return EXIT_SUCCESS;
}